

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O1

bool __thiscall
Js::InlineCache::PretendTryGetProperty
          (InlineCache *this,Type *type,PropertyCacheOperationInfo *operationInfo)

{
  Type *pTVar1;
  code *pcVar2;
  SlotType SVar3;
  SlotType SVar4;
  bool bVar5;
  undefined4 *puVar6;
  CacheType CVar7;
  Type *pTVar8;
  
  pTVar1 = (this->u).local.type;
  CVar7 = CacheType_Local;
  SVar4 = SlotType_Inline;
  if (pTVar1 != type) {
    pTVar8 = (Type *)((ulong)type | 4);
    if (pTVar1 == pTVar8) {
      SVar4 = SlotType_Aux;
      CVar7 = CacheType_Local;
    }
    else {
      pTVar1 = (this->u).local.typeWithoutProperty;
      SVar3 = SlotType_Inline;
      if (pTVar1 != type) {
        SVar4 = SlotType_Aux;
        SVar3 = SlotType_Aux;
        if (pTVar1 != pTVar8) {
          pTVar1 = (Type *)(this->u).proto.prototypeObject;
          if (pTVar1 == type) {
            CVar7 = CacheType_Getter;
            SVar4 = SlotType_Inline;
            if ((undefined1  [24])((undefined1  [24])this->u & (undefined1  [24])0x2) !=
                (undefined1  [24])0x0) goto LAB_00982755;
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar6 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                        ,0xee,"(u.accessor.flags & InlineCacheGetterFlag)",
                                        "u.accessor.flags & InlineCacheGetterFlag");
            if (!bVar5) goto LAB_00982823;
            SVar4 = SlotType_Inline;
          }
          else {
            if (pTVar1 != pTVar8) {
              return false;
            }
            CVar7 = CacheType_Getter;
            if ((undefined1  [24])((undefined1  [24])this->u & (undefined1  [24])0x2) !=
                (undefined1  [24])0x0) goto LAB_00982755;
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar6 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                        ,0xf7,"(u.accessor.flags & InlineCacheGetterFlag)",
                                        "u.accessor.flags & InlineCacheGetterFlag");
            if (!bVar5) {
LAB_00982823:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            SVar4 = SlotType_Aux;
          }
          *puVar6 = 0;
          CVar7 = CacheType_Getter;
          goto LAB_00982755;
        }
      }
      SVar4 = SVar3;
      CVar7 = CacheType_Proto;
    }
  }
LAB_00982755:
  operationInfo->cacheType = CVar7;
  operationInfo->slotType = SVar4;
  return true;
}

Assistant:

bool InlineCache::PretendTryGetProperty(Type *const type, PropertyCacheOperationInfo * operationInfo) const
    {
        if (type == u.local.type)
        {
            operationInfo->cacheType = CacheType_Local;
            operationInfo->slotType = SlotType_Inline;
            return true;
        }

        if (TypeWithAuxSlotTag(type) == u.local.type)
        {
            operationInfo->cacheType = CacheType_Local;
            operationInfo->slotType = SlotType_Aux;
            return true;
        }

        if (type == u.proto.type)
        {
            operationInfo->cacheType = CacheType_Proto;
            operationInfo->slotType = SlotType_Inline;
            return true;
        }

        if (TypeWithAuxSlotTag(type) == u.proto.type)
        {
            operationInfo->cacheType = CacheType_Proto;
            operationInfo->slotType = SlotType_Aux;
            return true;
        }

        if (type == u.accessor.type)
        {
            Assert(u.accessor.flags & InlineCacheGetterFlag);

            operationInfo->cacheType = CacheType_Getter;
            operationInfo->slotType = SlotType_Inline;
            return true;
        }

        if (TypeWithAuxSlotTag(type) == u.accessor.type)
        {
            Assert(u.accessor.flags & InlineCacheGetterFlag);

            operationInfo->cacheType = CacheType_Getter;
            operationInfo->slotType = SlotType_Aux;
            return true;
        }

        return false;
    }